

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket_linux.cpp
# Opt level: O0

int sk_server_start_loop(int port,void *userdata)

{
  int iVar1;
  char *port_00;
  __cxx11 local_38 [32];
  void *local_18;
  void *userdata_local;
  int port_local;
  
  local_18 = userdata;
  userdata_local._4_4_ = port;
  std::__cxx11::to_string(local_38,port);
  port_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ep_server_start_loop(port_00,local_18);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1;
}

Assistant:

int sk_server_start_loop(int port, void* userdata) {
    return ep_server_start_loop(std::to_string(port).c_str(), userdata);
}